

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O2

ArgInfo * __thiscall
SoapySDR::Device::getSettingInfo
          (ArgInfo *__return_storage_ptr__,Device *this,int direction,size_t channel,string *key)

{
  pointer pAVar1;
  __type _Var2;
  undefined4 in_register_00000014;
  ArgInfo *pAVar3;
  long lVar4;
  long lVar5;
  pointer __lhs;
  ArgInfoList allArgInfos;
  vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> local_48;
  
  (*this->_vptr_Device[0x68])(&local_48,this,CONCAT44(in_register_00000014,direction));
  pAVar1 = local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
  __lhs = local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl
          .super__Vector_impl_data._M_start;
  for (lVar5 = lVar4 / 0xf0 >> 2; pAVar3 = __lhs, 0 < lVar5; lVar5 = lVar5 + -1) {
    _Var2 = std::operator==(&__lhs->key,key);
    if (_Var2) goto LAB_0011ee68;
    _Var2 = std::operator==(&__lhs[1].key,key);
    pAVar3 = __lhs + 1;
    if (_Var2) goto LAB_0011ee68;
    _Var2 = std::operator==(&__lhs[2].key,key);
    pAVar3 = __lhs + 2;
    if (_Var2) goto LAB_0011ee68;
    _Var2 = std::operator==(&__lhs[3].key,key);
    pAVar3 = __lhs + 3;
    if (_Var2) goto LAB_0011ee68;
    __lhs = __lhs + 4;
    lVar4 = lVar4 + -0x3c0;
  }
  lVar4 = lVar4 / 0xf0;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pAVar3 = pAVar1;
      if ((lVar4 != 3) || (_Var2 = std::operator==(&__lhs->key,key), pAVar3 = __lhs, _Var2))
      goto LAB_0011ee68;
      pAVar3 = __lhs + 1;
    }
    _Var2 = std::operator==(&pAVar3->key,key);
    if (_Var2) goto LAB_0011ee68;
    __lhs = pAVar3 + 1;
  }
  _Var2 = std::operator==(&__lhs->key,key);
  pAVar3 = pAVar1;
  if (_Var2) {
    pAVar3 = __lhs;
  }
LAB_0011ee68:
  if (pAVar3 == local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    ArgInfo::ArgInfo(__return_storage_ptr__);
  }
  else {
    ArgInfo::ArgInfo(__return_storage_ptr__,pAVar3);
  }
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

SoapySDR::ArgInfo SoapySDR::Device::getSettingInfo(const int direction, const size_t channel, const std::string &key) const
{
    const auto allArgInfos = this->getSettingInfo(direction, channel);
    auto argInfoIter = std::find_if(
        allArgInfos.begin(),
        allArgInfos.end(),
        [&key](const SoapySDR::ArgInfo &argInfo)
        {
            return (argInfo.key == key);
        });

    return (argInfoIter != allArgInfos.end()) ? (*argInfoIter) : SoapySDR::ArgInfo();
}